

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary_gnu(FILE *fp,void **argtable)

{
  byte *pbVar1;
  char *__s;
  size_t sVar2;
  ushort **ppuVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  char *in_stack_fffffffffffffee8;
  uint local_110;
  uint local_f8 [50];
  
  lVar9 = 0;
  while( true ) {
    pbVar1 = (byte *)argtable[lVar9];
    if ((*pbVar1 & 1) != 0) break;
    if (*(long *)(pbVar1 + 0x20) != 0) {
      memset(local_f8,0,200);
      if (*(char **)(pbVar1 + 0x10) != (char *)0x0 && *(size_t *)(pbVar1 + 8) == 0) {
        local_f8[0] = 0x20202020;
      }
      __s = *(char **)(pbVar1 + 0x20);
      arg_cat_optionv((char *)local_f8,*(size_t *)(pbVar1 + 8),*(char **)(pbVar1 + 0x10),
                      *(char **)(pbVar1 + 0x18),(char *)(ulong)(*pbVar1 & 4),0x10a654,
                      in_stack_fffffffffffffee8);
      sVar2 = strlen((char *)local_f8);
      if (0x19 < sVar2) {
        fprintf((FILE *)fp,"  %-25s %s\n",local_f8,"");
        local_f8[0] = local_f8[0] & 0xffffff00;
      }
      uVar8 = 0;
      fprintf((FILE *)fp,"  %-25s ",local_f8);
      sVar2 = strlen(__s);
      uVar6 = sVar2 & 0xffffffff;
      while( true ) {
        uVar7 = (uint)uVar8;
        iVar4 = (uint)uVar6 - uVar7;
        if ((uint)uVar6 < uVar7 || iVar4 == 0) break;
        ppuVar3 = __ctype_b_loc();
        uVar5 = iVar4 + 2;
        iVar4 = uVar7 - 1;
        uVar6 = uVar8;
        do {
          uVar8 = uVar6 & 0xffffffff;
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar5 = uVar5 - 1;
          iVar4 = iVar4 + 1;
        } while ((*(byte *)((long)*ppuVar3 + (long)__s[uVar8] * 2 + 1) & 0x20) != 0);
        if (0x33 < uVar5) {
          uVar5 = 0x34;
        }
        uVar6 = (ulong)((uVar5 + iVar4) - 1);
        for (; uVar8 < uVar6; uVar8 = uVar8 + 1) {
          fputc((int)__s[uVar8],(FILE *)fp);
        }
        fputc(10,(FILE *)fp);
        local_110 = (uint)sVar2;
        if (uVar5 + iVar4 < local_110) {
          iVar4 = 0x1c;
          while (bVar10 = iVar4 != 0, iVar4 = iVar4 + -1, uVar6 = sVar2, bVar10) {
            fputc(0x20,(FILE *)fp);
          }
        }
      }
    }
    lVar9 = lVar9 + 1;
  }
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

void arg_print_glossary_gnu(FILE * fp, void * *argtable ) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int tabindex;

	for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
		if (table[tabindex]->glossary) {
			char syntax[200] = "";
			const char * shortopts = table[tabindex]->shortopts;
			const char * longopts  = table[tabindex]->longopts;
			const char * datatype  = table[tabindex]->datatype;
			const char * glossary  = table[tabindex]->glossary;

			if ( !shortopts && longopts ) {
				/* Indent trailing line by 4 spaces... */
				memset( syntax, ' ', 4 );
				*(syntax + 4) = '\0';
			}

			arg_cat_optionv(syntax,
							sizeof(syntax),
							shortopts,
							longopts,
							datatype,
							table[tabindex]->flag & ARG_HASOPTVALUE,
							", ");

			/* If syntax fits not into column, print glossary in new line... */
			if ( strlen(syntax) > 25 ) {
				fprintf( fp, "  %-25s %s\n", syntax, "" );
				*syntax = '\0';
			}

			fprintf( fp, "  %-25s ", syntax );
			arg_print_formatted( fp, 28, 79, glossary );
		}
	} /* for each table entry */

	fputc( '\n', fp );
}